

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::SimpleDescriptorDatabaseExtraTest_AddUnowned_Test::TestBody
          (SimpleDescriptorDatabaseExtraTest_AddUnowned_Test *this)

{
  bool bVar1;
  void *pvVar2;
  Arena *pAVar3;
  char *in_R9;
  pointer *__ptr_1;
  pointer *__ptr;
  char *pcVar4;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  packages;
  SimpleDescriptorDatabase db;
  FileDescriptorProto b;
  FileDescriptorProto f;
  AssertHelper local_2f0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  undefined1 local_2d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_2b0;
  pointer local_2a8;
  AssertHelper local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  SimpleDescriptorDatabase local_278;
  undefined1 local_210 [200];
  ArenaStringPtr local_148;
  ArenaStringPtr local_140 [5];
  undefined1 local_118 [200];
  ArenaStringPtr local_50;
  ArenaStringPtr local_48 [5];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_118,(Arena *)0x0);
  local_118[0x10] = local_118[0x10] | 1;
  pAVar3 = (Arena *)local_118._8_8_;
  if ((local_118._8_8_ & 1) != 0) {
    pAVar3 = *(Arena **)(local_118._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set(&local_50,value,pAVar3);
  local_118[0x10] = local_118[0x10] | 2;
  if ((local_118._8_8_ & 1) != 0) {
    local_118._8_8_ = *(undefined8 *)(local_118._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "foo";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(local_48,value_00,(Arena *)local_118._8_8_);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_118 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pAVar3 = *(Arena **)((long)pvVar2 + 8);
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  value_01._M_str = "Foo";
  value_01._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar2 + 0xd8),value_01,pAVar3);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_210,(Arena *)0x0);
  local_210[0x10] = local_210[0x10] | 1;
  pAVar3 = (Arena *)local_210._8_8_;
  if ((local_210._8_8_ & 1) != 0) {
    pAVar3 = *(Arena **)(local_210._8_8_ & 0xfffffffffffffffe);
  }
  value_02._M_str = "bar.proto";
  value_02._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set(&local_148,value_02,pAVar3);
  local_210[0x10] = local_210[0x10] | 2;
  if ((local_210._8_8_ & 1) != 0) {
    local_210._8_8_ = *(undefined8 *)(local_210._8_8_ & 0xfffffffffffffffe);
  }
  pcVar4 = anon_var_dwarf_a22956 + 5;
  protobuf::internal::ArenaStringPtr::Set
            (local_140,(string_view)(ZEXT816(0x10f75f1) << 0x40),(Arena *)local_210._8_8_);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_210 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pAVar3 = *(Arena **)((long)pvVar2 + 8);
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  value_03._M_str = "Bar";
  value_03._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar2 + 0xd8),value_03,pAVar3);
  SimpleDescriptorDatabase::SimpleDescriptorDatabase(&local_278);
  SimpleDescriptorDatabase::AddUnowned(&local_278,(FileDescriptorProto *)local_118);
  SimpleDescriptorDatabase::AddUnowned(&local_278,(FileDescriptorProto *)local_210);
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = DescriptorDatabase::FindAllPackageNames(&local_278.super_DescriptorDatabase,&local_298);
  local_2b8[0] = bVar1;
  pbStack_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d8,(internal *)local_2b8,
               (AssertionResult *)"db.FindAllPackageNames(&packages)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x232,(char *)CONCAT71(local_2d8._1_7_,local_2d8[0]));
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2d8._1_7_,local_2d8[0]) != &local_2c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2d8._1_7_,local_2d8[0]),local_2c8._M_allocated_capacity + 1)
      ;
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
    if (pbStack_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_2b0,pbStack_2b0);
    }
  }
  local_2b8 = (undefined1  [8])((long)anon_var_dwarf_a22956 + 5);
  pbStack_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10ebf8c;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(local_2d8,local_2b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"packages");
  if (local_2d8[0] == '\0') {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x233,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_2b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  local_2b8 = (undefined1  [8])0x0;
  pbStack_2b0 = (pointer)0x0;
  local_2a8 = (pointer)0x0;
  bVar1 = DescriptorDatabase::FindAllMessageNames
                    (&local_278.super_DescriptorDatabase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2b8);
  local_2e8._M_head_impl._0_1_ = bVar1;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d8,(internal *)&local_2e8,
               (AssertionResult *)"db.FindAllMessageNames(&messages)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x235,(char *)CONCAT71(local_2d8._1_7_,local_2d8[0]));
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2d8._1_7_,local_2d8[0]) != &local_2c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2d8._1_7_,local_2d8[0]),local_2c8._M_allocated_capacity + 1)
      ;
    }
    if (local_2f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f0.data_ + 8))();
    }
    if (local_2e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2e0,local_2e0);
    }
  }
  local_2e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x107f302;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x119d53f;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(local_2d8,(char *)&local_2e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x12d5066);
  if (local_2d8[0] == '\0') {
    testing::Message::Message((Message *)&local_2e8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x236,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase(&local_278);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_210);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  return;
}

Assistant:

TEST(SimpleDescriptorDatabaseExtraTest, AddUnowned) {
  FileDescriptorProto f;
  f.set_name("foo.proto");
  f.set_package("foo");
  f.add_message_type()->set_name("Foo");

  FileDescriptorProto b;
  b.set_name("bar.proto");
  b.set_package("");
  b.add_message_type()->set_name("Bar");

  SimpleDescriptorDatabase db;
  db.AddUnowned(&f);
  db.AddUnowned(&b);

  std::vector<std::string> packages;
  EXPECT_TRUE(db.FindAllPackageNames(&packages));
  EXPECT_THAT(packages, ::testing::UnorderedElementsAre("foo", ""));
  std::vector<std::string> messages;
  EXPECT_TRUE(db.FindAllMessageNames(&messages));
  EXPECT_THAT(messages, ::testing::UnorderedElementsAre("foo.Foo", "Bar"));
}